

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O2

uchar * CompressData(uchar *data,int dataSize,int *compDataSize)

{
  uint uVar1;
  sdefl *s;
  uchar *out;
  
  s = (sdefl *)calloc(1,0xeb5fc);
  out = (uchar *)calloc((long)(((dataSize + 0xfffe) / 0xffff) * 5 + dataSize + 0x12),1);
  uVar1 = sdeflate(s,out,data,dataSize,8);
  *compDataSize = uVar1;
  free(s);
  TraceLog(3,"SYSTEM: Compress data: Original size: %i -> Comp. size: %i",dataSize,(ulong)uVar1);
  return out;
}

Assistant:

unsigned char *CompressData(const unsigned char *data, int dataSize, int *compDataSize)
{
    #define COMPRESSION_QUALITY_DEFLATE  8

    unsigned char *compData = NULL;

#if defined(SUPPORT_COMPRESSION_API)
    // Compress data and generate a valid DEFLATE stream
    struct sdefl *sdefl = RL_CALLOC(1, sizeof(struct sdefl));   // WARNING: Possible stack overflow, struct sdefl is almost 1MB
    int bounds = sdefl_bound(dataSize);
    compData = (unsigned char *)RL_CALLOC(bounds, 1);

    *compDataSize = sdeflate(sdefl, compData, data, dataSize, COMPRESSION_QUALITY_DEFLATE);   // Compression level 8, same as stbiw
    RL_FREE(sdefl);

    TRACELOG(LOG_INFO, "SYSTEM: Compress data: Original size: %i -> Comp. size: %i", dataSize, *compDataSize);
#endif

    return compData;
}